

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O1

void ht_listener_buffer_process_unserialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  
  if (buffer->max_size != 0) {
    if (size != 0) {
      uVar3 = 0;
      do {
        plVar1 = (long *)(events + uVar3);
        lVar2 = (**(code **)(*(long *)(events + uVar3) + 0x10))(plVar1);
        if (buffer->max_size < lVar2 + buffer->usage) {
          (*flush_callback)(listener,buffer->data,buffer->usage);
          buffer->usage = 0;
        }
        lVar2 = (**(code **)(*plVar1 + 8))(plVar1,buffer->data + buffer->usage);
        buffer->usage = buffer->usage + lVar2;
        uVar3 = uVar3 + *(long *)(*(long *)*plVar1 + 0x10);
      } while (uVar3 < size);
    }
    return;
  }
  __assert_fail("!HT_IS_BYPASS_MODE(buffer)",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O1/hawktracer.c"
                ,0xaf7,
                "void ht_listener_buffer_process_unserialized_events(HT_ListenerBuffer *, TEventPtr, size_t, HT_ListenerFlushCallback, void *)"
               );
}

Assistant:

void
ht_listener_buffer_process_unserialized_events(HT_ListenerBuffer* buffer,
                                               TEventPtr events,
                                               size_t size,
                                               HT_ListenerFlushCallback flush_callback,
                                               void* listener)
{
    size_t i;

    assert(!HT_IS_BYPASS_MODE(buffer));

    for (i = 0; i < size;)
    {
        HT_Event* event = HT_EVENT(events + i);

        if (HT_EVENT_GET_KLASS(event)->get_size(event) + buffer->usage > buffer->max_size)
        {
            ht_listener_buffer_flush(buffer, flush_callback, listener);
        }

        buffer->usage += HT_EVENT_GET_KLASS(event)->serialize(event, buffer->data + buffer->usage);
        i += HT_EVENT_GET_KLASS(event)->type_info->size;
    }
}